

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownOrClause
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var1;
  bool bVar2;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var3;
  ExpressionType type;
  BoundConjunctionExpression *pBVar4;
  pointer puVar5;
  reference this_01;
  pointer pEVar6;
  BoundComparisonExpression *pBVar7;
  BoundColumnRefExpression *pBVar8;
  const_reference pvVar9;
  BoundConstantExpression *pBVar10;
  pointer pCVar11;
  pointer pOVar12;
  pointer puVar13;
  FilterPushdownResult FVar14;
  FilterPushdownResult FVar15;
  ulong __n;
  ExpressionType comparison_type;
  TableFilter *local_98;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_90;
  optional_ptr<duckdb::BoundConstantExpression,_true> const_val;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_80;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_78;
  BoundColumnRefExpression *local_70;
  vector<duckdb::ColumnIndex,_true> *local_68;
  TableFilterSet *local_60;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_58;
  optional_ptr<duckdb::BoundColumnRefExpression,_true> column_ref;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> local_48;
  
  FVar14 = NO_PUSHDOWN;
  if (((expr->super_BaseExpression).expression_class == BOUND_CONJUNCTION) &&
     (local_68 = column_ids, local_60 = table_filters,
     pBVar4 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>(&expr->super_BaseExpression),
     (pBVar4->super_Expression).super_BaseExpression.type == CONJUNCTION_OR)) {
    make_uniq<duckdb::ConjunctionOrFilter>();
    puVar13 = (pBVar4->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (pBVar4->children).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar13 == puVar5) {
      FVar14 = NO_PUSHDOWN;
    }
    else {
      local_58 = &pBVar4->children;
      local_70 = (BoundColumnRefExpression *)0x0;
      FVar15 = NO_PUSHDOWN;
      for (__n = 0; __n < (ulong)((long)puVar5 - (long)puVar13 >> 3); __n = __n + 1) {
        this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(local_58,__n);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_01);
        FVar14 = FVar15;
        if ((pEVar6->super_BaseExpression).expression_class != BOUND_COMPARISON) goto LAB_015bf7e1;
        column_ref.ptr = (BoundColumnRefExpression *)0x0;
        const_val.ptr = (BoundConstantExpression *)0x0;
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_01);
        pBVar7 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                           (&pEVar6->super_BaseExpression);
        this_00 = &pBVar7->left;
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_00);
        if ((pEVar6->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar7->right);
          if ((pEVar6->super_BaseExpression).expression_class != BOUND_CONSTANT) goto LAB_015bf573;
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_00);
          column_ref.ptr =
               BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar6->super_BaseExpression)
          ;
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar7->right);
          const_val.ptr =
               BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar6->super_BaseExpression);
          bVar2 = false;
        }
        else {
LAB_015bf573:
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_00);
          if ((pEVar6->super_BaseExpression).expression_class != BOUND_CONSTANT) goto LAB_015bf7e1;
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar7->right);
          FVar14 = NO_PUSHDOWN;
          if ((pEVar6->super_BaseExpression).expression_class != BOUND_COLUMN_REF)
          goto LAB_015bf7e1;
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(&pBVar7->right);
          column_ref.ptr =
               BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar6->super_BaseExpression)
          ;
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_00);
          const_val.ptr =
               BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar6->super_BaseExpression);
          bVar2 = true;
        }
        if (__n == 0) {
          pBVar8 = optional_ptr<duckdb::BoundColumnRefExpression,_true>::operator->(&column_ref);
          pvVar9 = vector<duckdb::ColumnIndex,_true>::get<true>
                             (local_68,(pBVar8->binding).column_index);
          local_70 = (BoundColumnRefExpression *)pvVar9->index;
        }
        else {
          pBVar8 = optional_ptr<duckdb::BoundColumnRefExpression,_true>::operator->(&column_ref);
          pvVar9 = vector<duckdb::ColumnIndex,_true>::get<true>
                             (local_68,(pBVar8->binding).column_index);
          FVar14 = FVar15;
          if (local_70 != (BoundColumnRefExpression *)pvVar9->index) goto LAB_015bf7e1;
        }
        type = (pBVar7->super_Expression).super_BaseExpression.type;
        if (bVar2) {
          type = FlipComparisonExpression(type);
        }
        comparison_type = type;
        pBVar10 = optional_ptr<duckdb::BoundConstantExpression,_true>::operator->(&const_val);
        if ((pBVar10->value).is_null == true) {
          if (comparison_type == COMPARE_DISTINCT_FROM) {
            make_uniq<duckdb::IsNotNullFilter>();
            pCVar11 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                      ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                    *)&local_80);
            local_90._M_head_impl = local_98;
            local_98 = (TableFilter *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                        *)&(pCVar11->super_ConjunctionFilter).child_filters,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_90);
            goto LAB_015bf70b;
          }
          if (comparison_type == COMPARE_BOUNDARY_END) {
            make_uniq<duckdb::IsNullFilter>();
            pCVar11 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                      ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                    *)&local_80);
            local_90._M_head_impl = local_98;
            local_98 = (TableFilter *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                        *)&(pCVar11->super_ConjunctionFilter).child_filters,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_90);
            goto LAB_015bf70b;
          }
        }
        else {
          pBVar10 = optional_ptr<duckdb::BoundConstantExpression,_true>::operator->(&const_val);
          make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType&,duckdb::Value&>
                    ((duckdb *)&local_98,&comparison_type,&pBVar10->value);
          pCVar11 = unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                    ::operator->((unique_ptr<duckdb::ConjunctionOrFilter,_std::default_delete<duckdb::ConjunctionOrFilter>,_true>
                                  *)&local_80);
          local_90._M_head_impl = local_98;
          local_98 = (TableFilter *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>
                      *)&(pCVar11->super_ConjunctionFilter).child_filters,
                     (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      *)&local_90);
LAB_015bf70b:
          if (local_90._M_head_impl != (TableFilter *)0x0) {
            (*(local_90._M_head_impl)->_vptr_TableFilter[1])();
          }
          if (local_98 != (TableFilter *)0x0) {
            (*local_98->_vptr_TableFilter[1])();
          }
        }
        puVar13 = (pBVar4->children).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar5 = (pBVar4->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      make_uniq<duckdb::OptionalFilter>();
      _Var3._M_head_impl = local_80._M_head_impl;
      local_80._M_head_impl = (TableFilter *)0x0;
      pOVar12 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                ::operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                              *)&const_val);
      _Var1._M_head_impl =
           (pOVar12->child_filter).
           super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
           super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
      (pOVar12->child_filter).
      super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
      super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var3._M_head_impl;
      if (_Var1._M_head_impl != (TableFilter *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableFilter + 8))();
      }
      local_78._M_head_impl = (TableFilter *)const_val.ptr;
      column_ref.ptr = local_70;
      local_48.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      const_val.ptr = (BoundConstantExpression *)0x0;
      local_48.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      TableFilterSet::PushFilter
                (local_60,(ColumnIndex *)&column_ref,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_78);
      if ((BoundConstantExpression *)local_78._M_head_impl != (BoundConstantExpression *)0x0) {
        (*(((Expression *)&(local_78._M_head_impl)->_vptr_TableFilter)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      local_78._M_head_impl = (TableFilter *)0x0;
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&local_48);
      if (const_val.ptr != (BoundConstantExpression *)0x0) {
        (*((const_val.ptr)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
      }
      FVar14 = PUSHED_DOWN_PARTIALLY;
    }
LAB_015bf7e1:
    if (local_80._M_head_impl != (TableFilter *)0x0) {
      (*(local_80._M_head_impl)->_vptr_TableFilter[1])();
    }
  }
  return FVar14;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownOrClause(TableFilterSet &table_filters,
                                                         const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::BOUND_CONJUNCTION) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &conj = expr.Cast<BoundConjunctionExpression>();
	if (conj.GetExpressionType() != ExpressionType::CONJUNCTION_OR) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto conj_filter = make_uniq<ConjunctionOrFilter>();
	if (conj.children.empty()) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	idx_t column_id = 0;
	for (idx_t i = 0; i < conj.children.size(); i++) {
		auto &child = conj.children[i];
		if (child->GetExpressionClass() != ExpressionClass::BOUND_COMPARISON) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}
		optional_ptr<BoundColumnRefExpression> column_ref;
		optional_ptr<BoundConstantExpression> const_val;
		auto &comp = child->Cast<BoundComparisonExpression>();
		bool invert = false;
		if (comp.left->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF &&
		    comp.right->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
			column_ref = comp.left->Cast<BoundColumnRefExpression>();
			const_val = comp.right->Cast<BoundConstantExpression>();
		} else if (comp.left->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT &&
		           comp.right->GetExpressionClass() == ExpressionClass::BOUND_COLUMN_REF) {
			column_ref = comp.right->Cast<BoundColumnRefExpression>();
			const_val = comp.left->Cast<BoundConstantExpression>();
			invert = true;
		} else {
			// child of OR filter is not simple so we do not push the or filter down at all
			return FilterPushdownResult::NO_PUSHDOWN;
		}

		if (i == 0) {
			auto &col_id = column_ids[column_ref->binding.column_index];
			column_id = col_id.GetPrimaryIndex();
		} else if (column_id != column_ids[column_ref->binding.column_index].GetPrimaryIndex()) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}

		auto comparison_type = invert ? FlipComparisonExpression(comp.GetExpressionType()) : comp.GetExpressionType();
		if (const_val->value.IsNull()) {
			switch (comparison_type) {
			case ExpressionType::COMPARE_DISTINCT_FROM: {
				auto null_filter = make_uniq<IsNotNullFilter>();
				conj_filter->child_filters.push_back(std::move(null_filter));
				break;
			}
			case ExpressionType::COMPARE_NOT_DISTINCT_FROM: {
				auto null_filter = make_uniq<IsNullFilter>();
				conj_filter->child_filters.push_back(std::move(null_filter));
				break;
			}
			default:
				// if any other comparison type (i.e EQUAL, NOT_EQUAL) do not push a table filter - this is a nop
				// since x = NULL is always falsey, and this is a chain of OR conditions, we can just ignore it
				break;
			}
		} else {
			auto const_filter = make_uniq<ConstantFilter>(comparison_type, const_val->value);
			conj_filter->child_filters.push_back(std::move(const_filter));
		}
	}
	auto optional_filter = make_uniq<OptionalFilter>();
	optional_filter->child_filter = std::move(conj_filter);
	table_filters.PushFilter(ColumnIndex(column_id), std::move(optional_filter));
	return FilterPushdownResult::PUSHED_DOWN_PARTIALLY;
}